

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O0

bool __thiscall BoolLinearLE<0>::propagate(BoolLinearLE<0> *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  Tint *in_RDI;
  uint i;
  int64_t v;
  int y_max;
  int64_t in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar7;
  BoolView *in_stack_ffffffffffffffa8;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  Reason local_38;
  uint local_2c;
  Reason local_28;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  int local_14;
  bool local_1;
  
  iVar5 = IntView<0>::getMax((IntView<0> *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_14 = (int)iVar5;
  iVar3 = Tint::operator_cast_to_int(in_RDI + 0xe);
  if (local_14 < iVar3) {
    Tint::operator=(in_RDI,in_stack_ffffffffffffffbc);
  }
  iVar3 = Tint::operator_cast_to_int(in_RDI + 0xe);
  local_20 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar3;
  bVar2 = IntView<0>::setMinNotR
                    ((IntView<0> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar1 = 0;
  if (bVar2) {
    in_stack_ffffffffffffffa8 = (BoolView *)(in_RDI + 10);
    in_stack_ffffffffffffffb0 = local_20;
    Reason::Reason(&local_28,in_RDI[2].v,1);
    bVar2 = IntView<0>::setMin((IntView<0> *)in_stack_ffffffffffffffa8,
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (Reason)in_stack_ffffffffffffffb0,(bool)uVar6);
    bVar1 = bVar2 ^ 0xff;
  }
  if ((bVar1 & 1) == 0) {
    iVar3 = Tint::operator_cast_to_int(in_RDI + 0xe);
    if (iVar3 == local_14) {
      local_2c = 0;
      while (uVar7 = local_2c, uVar4 = vec<BoolView>::size((vec<BoolView> *)(in_RDI + 6)),
            uVar7 < uVar4) {
        vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 6),local_2c);
        uVar6 = (undefined1)(uVar7 >> 0x18);
        bVar2 = BoolView::isFixed((BoolView *)0x19137e);
        if (!bVar2) {
          vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 6),local_2c);
          Reason::Reason(&local_38,in_RDI[2].v,0);
          BoolView::setVal2(in_stack_ffffffffffffffa8,(bool)uVar6,(Reason)in_stack_ffffffffffffffb0)
          ;
        }
        local_2c = local_2c + 1;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool propagate() override {
		const int y_max = static_cast<int>(y.getMax());

		if (ones > y_max) {
			ones = y_max + 1;
		}

		setDom2(y, setMin, ones, 1);

		if (ones == y_max) {
			for (unsigned int i = 0; i < x.size(); i++) {
				if (!x[i].isFixed()) {
					x[i].setVal2(false, Reason(prop_id, 0));
				}
			}
		}

		return true;
	}